

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

Image * Image_Function_Helper::Rotate
                  (Image *__return_storage_ptr__,RotateForm4 rotate,Image *in,double centerX,
                  double centerY,double angle)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*rotate)(in,0,0,centerX,centerY,__return_storage_ptr__,0,0,centerX,centerY,in->_width,in->_height
            ,angle);
  return __return_storage_ptr__;
}

Assistant:

Image Rotate( FunctionTable::RotateForm4 rotate,
                  const Image & in, double centerX, double centerY, double angle )
    {
        Image_Function::ParameterValidation( in );
        Image_Function::VerifyGrayScaleImage( in );
        Image out = in.generate( in.width(), in.height() );

        rotate( in, 0, 0, centerX, centerY, out, 0, 0, centerX, centerY, in.width(), in.height(), angle );

        return out;
    }